

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timedependent.hxx
# Opt level: O1

void __thiscall Time::Time(Time *this,double timestep)

{
  Physical::Physical(&this->super_Physical);
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__Time_0015f720;
  (this->timeObjects).super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->timeObjects).super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->timeObjects).super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->timeEstimators).super__Vector_base<Estimator_*,_std::allocator<Estimator_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->timeEstimators).super__Vector_base<Estimator_*,_std::allocator<Estimator_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->timeEstimators).super__Vector_base<Estimator_*,_std::allocator<Estimator_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->dt = timestep;
  Unit::set(&(this->super_Physical).physicalUnit,0,0,0,1,0,0,0,0);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_Physical).physicalDescription,0,
             (char *)(this->super_Physical).physicalDescription._M_string_length,0x14e74b);
  return;
}

Assistant:

Time(double timestep) {
		dt = timestep; 
		physicalUnit.set(0, 0,0,1,0,0,0,0); // ms
		physicalDescription = "time";
	}